

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_functional.h
# Opt level: O2

void __thiscall
mp::
BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadraticFunctionalConstraint>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadraticFunctionalConstraint>
::AddResultVariable(BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadraticFunctionalConstraint>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadraticFunctionalConstraint>
                    *this)

{
  NodeRange NVar1;
  
  NVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::AddVar((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)this->converter_,(this->prepro_).lb_,(this->prepro_).ub_,(this->prepro_).type_
                  );
  (this->prepro_).result_var_ = NVar1.ir_.beg_;
  (this->constr_).super_FunctionalConstraint.result_var_ = NVar1.ir_.beg_;
  return;
}

Assistant:

void AddResultVariable() {
    auto r = int( GetConverter().AddVar(lb(), ub(), type()) );
    SetResultVar( r );
    GetConstraint().SetResultVar( r );
	}